

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::ObjectivePropagation::updateActivityLbChange
          (ObjectivePropagation *this,HighsInt col,double oldbound,double newbound)

{
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *pvVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  HighsDomain *pHVar5;
  HighsMipSolver *pHVar6;
  pointer ppVar7;
  _Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *p_Var8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  pointer pOVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> local_58;
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *local_48;
  double local_40;
  double local_38;
  
  local_38 = newbound;
  while( true ) {
    local_40 = oldbound;
    pdVar4 = this->cost;
    dVar15 = pdVar4[col];
    if (dVar15 <= 0.0) {
      if ((local_38 < local_40) && ((dVar15 != 0.0 || (NAN(dVar15))))) {
        pHVar6 = this->domain->mipsolver;
        dVar16 = ((pHVar6->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        local_38 = (this->domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[col] - local_38;
        if ((pHVar6->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[col] == kContinuous) {
          dVar17 = local_38 * 0.3;
          dVar16 = dVar16 * 1000.0;
          if (dVar16 <= dVar17) {
            dVar16 = dVar17;
          }
        }
        dVar15 = (local_38 - dVar16) * -dVar15;
        if (dVar15 <= this->capacityThreshold) {
          dVar15 = this->capacityThreshold;
        }
        this->capacityThreshold = dVar15;
        this->isPropagated = false;
      }
      return;
    }
    this->isPropagated = false;
    uVar2 = (this->objFunc->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    lVar12 = (long)(int)uVar2;
    if (lVar12 != -1) break;
    if (-INFINITY < local_40) {
      dVar15 = dVar15 * local_40;
      dVar16 = (this->objectiveLower).hi;
      dVar17 = dVar16 - dVar15;
      (this->objectiveLower).hi = dVar17;
      (this->objectiveLower).lo =
           (dVar16 - (dVar15 + dVar17)) + (-dVar15 - (dVar17 - (dVar15 + dVar17))) +
           (this->objectiveLower).lo;
    }
    else {
      this->numInfObjLower = this->numInfObjLower + -1;
    }
    if (-INFINITY < local_38) {
      dVar16 = pdVar4[col] * local_38;
      dVar15 = (this->objectiveLower).hi;
      dVar17 = dVar15 + dVar16;
      (this->objectiveLower).hi = dVar17;
      (this->objectiveLower).lo =
           (dVar15 - (dVar17 - dVar16)) + (dVar16 - (dVar17 - (dVar17 - dVar16))) +
           (this->objectiveLower).lo;
    }
    else {
      this->numInfObjLower = this->numInfObjLower + 1;
    }
    if (local_38 < local_40) {
      pHVar5 = this->domain;
      dVar15 = ((pHVar5->mipsolver->mipdata_)._M_t.
                super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
                _M_t.
                super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      dVar16 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col] -
               (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[col];
      if ((pHVar5->mipsolver->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[col] == kContinuous) {
        dVar17 = dVar16 * 0.3;
        dVar15 = dVar15 * 1000.0;
        if (dVar15 <= dVar17) {
          dVar15 = dVar17;
        }
      }
      dVar15 = pdVar4[col] * (dVar16 - dVar15);
      if (dVar15 <= this->capacityThreshold) {
        dVar15 = this->capacityThreshold;
      }
      this->capacityThreshold = dVar15;
      return;
    }
    if (this->numInfObjLower != 0) {
      return;
    }
    pHVar5 = this->domain;
    dVar15 = (this->objectiveLower).hi + (this->objectiveLower).lo;
    pdVar4 = &((pHVar5->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
    if (dVar15 < *pdVar4 || dVar15 == *pdVar4) {
      return;
    }
    pHVar5->infeasible_ = true;
    pHVar5->infeasible_pos =
         (HighsInt)
         ((ulong)((long)(pHVar5->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pHVar5->domchgstack_).
                       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4);
    (pHVar5->infeasible_reason).type = -7;
    (pHVar5->infeasible_reason).index = 0;
    oldbound = local_38;
    local_38 = local_40;
  }
  pvVar1 = &this->objectiveLowerContributions;
  pOVar13 = (this->objectiveLowerContributions).
            super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48 = pvVar1;
  if ((local_38 != 0.0) || (NAN(local_38))) {
    ppVar7 = (this->contributionPartitionSets).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_58.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.rootNode =
         &ppVar7[pOVar13[lVar12].partition].first;
    local_58.first_ = &ppVar7[pOVar13[lVar12].partition].second;
    if (*local_58.first_ == uVar2) {
      dVar15 = pOVar13[lVar12].contribution;
      dVar16 = (this->objectiveLower).hi;
      dVar17 = dVar15 + dVar16;
      (this->objectiveLower).hi = dVar17;
      (this->objectiveLower).lo =
           (dVar16 - (dVar17 - dVar15)) + (dVar15 - (dVar17 - (dVar17 - dVar15))) +
           (this->objectiveLower).lo;
      ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::unlink
                (&local_58,(char *)(ulong)uVar2);
      if ((long)*local_58.first_ != -1) {
        dVar15 = (this->objectiveLowerContributions).
                 super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                 ._M_impl.super__Vector_impl_data._M_start[*local_58.first_].contribution;
        dVar16 = (this->objectiveLower).hi;
        dVar17 = dVar16 - dVar15;
        (this->objectiveLower).hi = dVar17;
        (this->objectiveLower).lo =
             (dVar16 - (dVar15 + dVar17)) + (-dVar15 - (dVar17 - (dVar15 + dVar17))) +
             (this->objectiveLower).lo;
      }
    }
    else {
      ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::unlink
                (&local_58,(char *)(ulong)uVar2);
    }
    if (this->numInfObjLower != 0) {
      return;
    }
    pHVar5 = this->domain;
    dVar15 = (this->objectiveLower).hi + (this->objectiveLower).lo;
    pdVar4 = &((pHVar5->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
    if (dVar15 < *pdVar4 || dVar15 == *pdVar4) {
      return;
    }
    pHVar5->infeasible_ = true;
    pHVar5->infeasible_pos =
         (HighsInt)
         ((ulong)((long)(pHVar5->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pHVar5->domchgstack_).
                       super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4);
    (pHVar5->infeasible_reason).type = -7;
    (pHVar5->infeasible_reason).index = 0;
    updateActivityLbChange(this,col,local_38,local_40);
    return;
  }
  ppVar7 = (this->contributionPartitionSets).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.rootNode =
       &ppVar7[pOVar13[lVar12].partition].first;
  local_58.first_ = &ppVar7[pOVar13[lVar12].partition].second;
  iVar3 = *local_58.first_;
  ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::link
            (&local_58.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>,
             (char *)(ulong)uVar2,
             (char *)local_58.
                     super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.
                     rootNode);
  dVar15 = 0.0;
  if ((long)iVar3 != -1) {
    dVar15 = (pvVar1->
             super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
             )._M_impl.super__Vector_impl_data._M_start[iVar3].contribution;
  }
  if (uVar2 == *local_58.first_) {
    pOVar13 = (pvVar1->
              super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((pOVar13[lVar12].contribution == dVar15) &&
       (!NAN(pOVar13[lVar12].contribution) && !NAN(dVar15))) goto LAB_002979ef;
    dVar16 = (this->objectiveLower).hi;
    dVar17 = dVar15 + dVar16;
    (this->objectiveLower).hi = dVar17;
    dVar16 = (dVar16 - (dVar17 - dVar15)) + (dVar15 - (dVar17 - (dVar17 - dVar15))) +
             (this->objectiveLower).lo;
    (this->objectiveLower).lo = dVar16;
    dVar15 = pOVar13[lVar12].contribution;
    dVar18 = dVar17 - dVar15;
    (this->objectiveLower).hi = dVar18;
    (this->objectiveLower).lo =
         (dVar17 - (dVar15 + dVar18)) + (-dVar15 - (dVar18 - (dVar15 + dVar18))) + dVar16;
    if (*local_58.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.
         rootNode == 0xffffffff) {
      uVar9 = 0xffffffff;
    }
    else {
      p_Var8 = &local_48->
                super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
      ;
      uVar10 = *local_58.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.
                rootNode;
      do {
        uVar11 = (p_Var8->_M_impl).super__Vector_impl_data._M_start[(int)uVar10].links.child[1];
        bVar14 = uVar11 != 0xffffffff;
        if (!bVar14) {
          uVar11 = uVar10;
        }
        local_48 = (vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                    *)((ulong)local_48 & 0xffffffff);
        if (!bVar14) {
          local_48 = (vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                      *)(ulong)uVar10;
        }
        uVar9 = (uint)local_48;
        uVar10 = uVar11;
      } while (bVar14);
    }
    dVar15 = pOVar13[lVar12].contribution;
    if (uVar9 == uVar2) goto LAB_002979f8;
    pOVar13 = pOVar13 + (int)uVar9;
  }
  else {
LAB_002979ef:
    pOVar13 = (pvVar1->
              super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
              )._M_impl.super__Vector_impl_data._M_start + lVar12;
  }
  dVar15 = dVar15 - pOVar13->contribution;
LAB_002979f8:
  dVar15 = (1.0 - ((this->domain->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol) *
           dVar15;
  dVar16 = this->capacityThreshold;
  if (this->capacityThreshold <= dVar15) {
    dVar16 = dVar15;
  }
  this->capacityThreshold = dVar16;
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::updateActivityLbChange(
    HighsInt col, double oldbound, double newbound) {
  if (cost[col] <= 0.0) {
    if (cost[col] != 0.0 && newbound < oldbound) {
      capacityThreshold =
          std::max(capacityThreshold,
                   -cost[col] * boundRange(domain->col_upper_[col], newbound,
                                           domain->feastol(),
                                           domain->variableType(col)));
      isPropagated = false;
    }
    debugCheckObjectiveLower();
    return;
  }

  isPropagated = false;

  HighsInt partitionPos = objFunc->getColCliquePartition(col);
  if (partitionPos == -1) {
    if (oldbound == -kHighsInf)
      --numInfObjLower;
    else
      objectiveLower -= oldbound * cost[col];

    if (newbound == -kHighsInf)
      ++numInfObjLower;
    else
      objectiveLower += newbound * cost[col];

    debugCheckObjectiveLower();

    if (newbound < oldbound) {
      capacityThreshold = std::max(
          capacityThreshold,
          cost[col] * boundRange(domain->col_upper_[col],
                                 domain->col_lower_[col], domain->feastol(),
                                 domain->variableType(col)));
    } else if (numInfObjLower == 0 &&
               objectiveLower > domain->mipsolver->mipdata_->upper_limit) {
      domain->infeasible_ = true;
      domain->infeasible_pos = domain->domchgstack_.size();
      domain->infeasible_reason = Reason::objective();
      updateActivityLbChange(col, newbound, oldbound);
    }
  } else {
    if (newbound == 0.0) {
      assert(oldbound == 1.0);
      // binary lower bound of variable in clique partition is relaxed to 0
      HighsInt partition = objectiveLowerContributions[partitionPos].partition;
      ObjectiveContributionTree contributionTree(this, partition);
      HighsInt currFirst = contributionTree.first();

      contributionTree.link(partitionPos);

      double oldContribution = 0.0;
      if (currFirst != -1)
        oldContribution = objectiveLowerContributions[currFirst].contribution;

      if (partitionPos == contributionTree.first() &&
          objectiveLowerContributions[partitionPos].contribution !=
              oldContribution) {
        objectiveLower += oldContribution;
        objectiveLower -=
            objectiveLowerContributions[partitionPos].contribution;

        // update the capacity threshold with the difference of the new highest
        // contribution position to the lowest contribution as the column with
        // the lowest contribution can be fixed to its bound that yields the
        // highest objective value.
        HighsInt bestPos = contributionTree.last();
        double delta = objectiveLowerContributions[partitionPos].contribution;
        if (bestPos != partitionPos)
          delta -= objectiveLowerContributions[bestPos].contribution;
        capacityThreshold =
            std::max(delta * (1.0 - domain->feastol()), capacityThreshold);
      } else {
        // the new linked column could be the one with the new lowest
        // contribution so update the capacity threshold to ensure propagation
        // runs when it can be fixed to the bound that yields the highest
        // objective value
        capacityThreshold =
            std::max((oldContribution -
                      objectiveLowerContributions[partitionPos].contribution) *
                         (1.0 - domain->feastol()),
                     capacityThreshold);
      }

      debugCheckObjectiveLower();
    } else {
      // binary lower bound of variable in clique partition is tightened to 1
      assert(oldbound == 0.0);
      assert(newbound == 1.0);

      HighsInt partition = objectiveLowerContributions[partitionPos].partition;
      ObjectiveContributionTree contributionTree(this, partition);
      bool wasFirst = contributionTree.first() == partitionPos;
      if (wasFirst)
        objectiveLower +=
            objectiveLowerContributions[partitionPos].contribution;

      contributionTree.unlink(partitionPos);

      if (wasFirst) {
        HighsInt newWorst = contributionTree.first();
        if (newWorst != -1)
          objectiveLower -= objectiveLowerContributions[newWorst].contribution;
      }

      debugCheckObjectiveLower();

      if (numInfObjLower == 0 &&
          objectiveLower > domain->mipsolver->mipdata_->upper_limit) {
        domain->infeasible_ = true;
        domain->infeasible_pos = domain->domchgstack_.size();
        domain->infeasible_reason = Reason::objective();
        updateActivityLbChange(col, newbound, oldbound);
      }
    }
  }
}